

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void fdct16x16_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  int iVar123;
  int iVar124;
  int32_t *piVar125;
  undefined8 *puVar126;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar168;
  int iVar169;
  int iVar170;
  int iVar171;
  int iVar172;
  int iVar173;
  int iVar174;
  int iVar175;
  int iVar176;
  int iVar177;
  undefined1 auVar139 [16];
  int col;
  __m128i x;
  __m128i v [16];
  __m128i u [16];
  __m128i rnding;
  __m128i cospi52;
  __m128i cospi12;
  __m128i cospi20;
  __m128i cospi44;
  __m128i cospi36;
  __m128i cospi28;
  __m128i cospi4;
  __m128i cospi60;
  __m128i cospi40;
  __m128i cospi24;
  __m128i cospi8;
  __m128i cospi56;
  __m128i cospim16;
  __m128i cospim48;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospim32;
  __m128i cospi32;
  int32_t *cospi;
  int local_1c1c;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  char local_18cc;
  int local_1878;
  int iStack_1874;
  int iStack_1870;
  int iStack_186c;
  int local_1868;
  int iStack_1864;
  int iStack_1860;
  int iStack_185c;
  int local_1818;
  int iStack_1814;
  int iStack_1810;
  int iStack_180c;
  int local_1808;
  int iStack_1804;
  int iStack_1800;
  int iStack_17fc;
  int local_17b8;
  int iStack_17b4;
  int iStack_17b0;
  int iStack_17ac;
  int local_17a8;
  int iStack_17a4;
  int iStack_17a0;
  int iStack_179c;
  int local_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int local_1748;
  int iStack_1744;
  int iStack_1740;
  int iStack_173c;
  int local_1678;
  int iStack_1674;
  int iStack_1670;
  int iStack_166c;
  int local_1668;
  int iStack_1664;
  int iStack_1660;
  int iStack_165c;
  int local_1618;
  int iStack_1614;
  int iStack_1610;
  int iStack_160c;
  int local_1608;
  int iStack_1604;
  int iStack_1600;
  int iStack_15fc;
  int local_15b8;
  int iStack_15b4;
  int iStack_15b0;
  int iStack_15ac;
  int local_15a8;
  int iStack_15a4;
  int iStack_15a0;
  int iStack_159c;
  int local_1558;
  int iStack_1554;
  int iStack_1550;
  int iStack_154c;
  int local_1548;
  int iStack_1544;
  int iStack_1540;
  int iStack_153c;
  int local_14b8;
  int iStack_14b4;
  int iStack_14b0;
  int iStack_14ac;
  int local_14a8;
  int iStack_14a4;
  int iStack_14a0;
  int iStack_149c;
  int local_1458;
  int iStack_1454;
  int iStack_1450;
  int iStack_144c;
  int local_1448;
  int iStack_1444;
  int iStack_1440;
  int iStack_143c;
  int local_1378;
  int iStack_1374;
  int iStack_1370;
  int iStack_136c;
  int local_1368;
  int iStack_1364;
  int iStack_1360;
  int iStack_135c;
  int local_12d8;
  int iStack_12d4;
  int iStack_12d0;
  int iStack_12cc;
  int local_12c8;
  int iStack_12c4;
  int iStack_12c0;
  int iStack_12bc;
  int local_1278;
  int iStack_1274;
  int iStack_1270;
  int iStack_126c;
  int local_1268;
  int iStack_1264;
  int iStack_1260;
  int iStack_125c;
  int local_11d8;
  int iStack_11d4;
  int iStack_11d0;
  int iStack_11cc;
  int local_11c8;
  int iStack_11c4;
  int iStack_11c0;
  int iStack_11bc;
  int local_11b8;
  int iStack_11b4;
  int iStack_11b0;
  int iStack_11ac;
  int local_11a8;
  int iStack_11a4;
  int iStack_11a0;
  int iStack_119c;
  int local_1198;
  int iStack_1194;
  int iStack_1190;
  int iStack_118c;
  int local_1188;
  int iStack_1184;
  int iStack_1180;
  int iStack_117c;
  int local_1178;
  int iStack_1174;
  int iStack_1170;
  int iStack_116c;
  int local_1168;
  int iStack_1164;
  int iStack_1160;
  int iStack_115c;
  int local_1158;
  int iStack_1154;
  int iStack_1150;
  int iStack_114c;
  int local_1148;
  int iStack_1144;
  int iStack_1140;
  int iStack_113c;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  int local_1128;
  int iStack_1124;
  int iStack_1120;
  int iStack_111c;
  int local_1118;
  int iStack_1114;
  int iStack_1110;
  int iStack_110c;
  int local_1108;
  int iStack_1104;
  int iStack_1100;
  int iStack_10fc;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  int local_10e8;
  int iStack_10e4;
  int iStack_10e0;
  int iStack_10dc;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  int local_10c8;
  int iStack_10c4;
  int iStack_10c0;
  int iStack_10bc;
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  int local_10a8;
  int iStack_10a4;
  int iStack_10a0;
  int iStack_109c;
  int local_1098;
  int iStack_1094;
  int iStack_1090;
  int iStack_108c;
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  int local_fc8;
  int iStack_fc4;
  int iStack_fc0;
  int iStack_fbc;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  int local_f88;
  int iStack_f84;
  int iStack_f80;
  int iStack_f7c;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  int local_f68;
  int iStack_f64;
  int iStack_f60;
  int iStack_f5c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_f08;
  int iStack_f04;
  int iStack_f00;
  int iStack_efc;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_de8;
  int iStack_de4;
  int iStack_de0;
  int iStack_ddc;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  int local_d28;
  int iStack_d24;
  int iStack_d20;
  int iStack_d1c;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  int local_d08;
  int iStack_d04;
  int iStack_d00;
  int iStack_cfc;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_ce8;
  int iStack_ce4;
  int iStack_ce0;
  int iStack_cdc;
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_ca8;
  int iStack_ca4;
  int iStack_ca0;
  int iStack_c9c;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c88;
  int iStack_c84;
  int iStack_c80;
  int iStack_c7c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c68;
  int iStack_c64;
  int iStack_c60;
  int iStack_c5c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c48;
  int iStack_c44;
  int iStack_c40;
  int iStack_c3c;
  
  piVar125 = cospi_arr(in_EDX);
  iVar1 = piVar125[0x20];
  uVar115 = CONCAT44(iVar1,iVar1);
  uVar116 = CONCAT44(iVar1,iVar1);
  iVar123 = -piVar125[0x20];
  uVar117 = CONCAT44(iVar123,iVar123);
  uVar118 = CONCAT44(iVar123,iVar123);
  iVar1 = piVar125[0x30];
  uVar119 = CONCAT44(iVar1,iVar1);
  uVar120 = CONCAT44(iVar1,iVar1);
  iVar1 = piVar125[0x10];
  iVar123 = -piVar125[0x30];
  iVar124 = -piVar125[0x10];
  uVar121 = CONCAT44(iVar124,iVar124);
  uVar122 = CONCAT44(iVar124,iVar124);
  iVar2 = piVar125[0x38];
  iVar3 = piVar125[8];
  iVar4 = piVar125[0x18];
  iVar5 = piVar125[0x28];
  iVar6 = piVar125[0x3c];
  iVar7 = piVar125[4];
  iVar8 = piVar125[0x1c];
  iVar9 = piVar125[0x24];
  iVar10 = piVar125[0x2c];
  iVar11 = piVar125[0x14];
  iVar12 = piVar125[0xc];
  iVar13 = piVar125[0x34];
  local_18cc = (char)in_EDX;
  iVar124 = 1 << (local_18cc - 1U & 0x1f);
  for (local_1c1c = 0; local_1c1c < in_ECX; local_1c1c = local_1c1c + 1) {
    puVar126 = (undefined8 *)(in_RDI + (long)local_1c1c * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xf + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_10e8 = (int)uVar14;
    iStack_10e4 = (int)((ulong)uVar14 >> 0x20);
    iStack_10e0 = (int)uVar15;
    iStack_10dc = (int)((ulong)uVar15 >> 0x20);
    local_10f8 = (int)uVar16;
    iStack_10f4 = (int)((ulong)uVar16 >> 0x20);
    iStack_10f0 = (int)uVar17;
    iStack_10ec = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)local_1c1c * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xf + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_c48 = (int)uVar14;
    iStack_c44 = (int)((ulong)uVar14 >> 0x20);
    iStack_c40 = (int)uVar15;
    iStack_c3c = (int)((ulong)uVar15 >> 0x20);
    local_c58 = (int)uVar16;
    iStack_c54 = (int)((ulong)uVar16 >> 0x20);
    iStack_c50 = (int)uVar17;
    iStack_c4c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xe + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_1108 = (int)uVar14;
    iStack_1104 = (int)((ulong)uVar14 >> 0x20);
    iStack_1100 = (int)uVar15;
    iStack_10fc = (int)((ulong)uVar15 >> 0x20);
    local_1118 = (int)uVar16;
    iStack_1114 = (int)((ulong)uVar16 >> 0x20);
    iStack_1110 = (int)uVar17;
    iStack_110c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xe + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_c68 = (int)uVar14;
    iStack_c64 = (int)((ulong)uVar14 >> 0x20);
    iStack_c60 = (int)uVar15;
    iStack_c5c = (int)((ulong)uVar15 >> 0x20);
    local_c78 = (int)uVar16;
    iStack_c74 = (int)((ulong)uVar16 >> 0x20);
    iStack_c70 = (int)uVar17;
    iStack_c6c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 2 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xd + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_1128 = (int)uVar14;
    iStack_1124 = (int)((ulong)uVar14 >> 0x20);
    iStack_1120 = (int)uVar15;
    iStack_111c = (int)((ulong)uVar15 >> 0x20);
    local_1138 = (int)uVar16;
    iStack_1134 = (int)((ulong)uVar16 >> 0x20);
    iStack_1130 = (int)uVar17;
    iStack_112c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 2 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xd + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_c88 = (int)uVar14;
    iStack_c84 = (int)((ulong)uVar14 >> 0x20);
    iStack_c80 = (int)uVar15;
    iStack_c7c = (int)((ulong)uVar15 >> 0x20);
    local_c98 = (int)uVar16;
    iStack_c94 = (int)((ulong)uVar16 >> 0x20);
    iStack_c90 = (int)uVar17;
    iStack_c8c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 3 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xc + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_1148 = (int)uVar14;
    iStack_1144 = (int)((ulong)uVar14 >> 0x20);
    iStack_1140 = (int)uVar15;
    iStack_113c = (int)((ulong)uVar15 >> 0x20);
    local_1158 = (int)uVar16;
    iStack_1154 = (int)((ulong)uVar16 >> 0x20);
    iStack_1150 = (int)uVar17;
    iStack_114c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 3 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xc + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_ca8 = (int)uVar14;
    iStack_ca4 = (int)((ulong)uVar14 >> 0x20);
    iStack_ca0 = (int)uVar15;
    iStack_c9c = (int)((ulong)uVar15 >> 0x20);
    local_cb8 = (int)uVar16;
    iStack_cb4 = (int)((ulong)uVar16 >> 0x20);
    iStack_cb0 = (int)uVar17;
    iStack_cac = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 4 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xb + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_1168 = (int)uVar14;
    iStack_1164 = (int)((ulong)uVar14 >> 0x20);
    iStack_1160 = (int)uVar15;
    iStack_115c = (int)((ulong)uVar15 >> 0x20);
    local_1178 = (int)uVar16;
    iStack_1174 = (int)((ulong)uVar16 >> 0x20);
    iStack_1170 = (int)uVar17;
    iStack_116c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 4 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 0xb + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_cc8 = (int)uVar14;
    iStack_cc4 = (int)((ulong)uVar14 >> 0x20);
    iStack_cc0 = (int)uVar15;
    iStack_cbc = (int)((ulong)uVar15 >> 0x20);
    local_cd8 = (int)uVar16;
    iStack_cd4 = (int)((ulong)uVar16 >> 0x20);
    iStack_cd0 = (int)uVar17;
    iStack_ccc = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 5 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 10 + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_1188 = (int)uVar14;
    iStack_1184 = (int)((ulong)uVar14 >> 0x20);
    iStack_1180 = (int)uVar15;
    iStack_117c = (int)((ulong)uVar15 >> 0x20);
    local_1198 = (int)uVar16;
    iStack_1194 = (int)((ulong)uVar16 >> 0x20);
    iStack_1190 = (int)uVar17;
    iStack_118c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 5 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 10 + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_ce8 = (int)uVar14;
    iStack_ce4 = (int)((ulong)uVar14 >> 0x20);
    iStack_ce0 = (int)uVar15;
    iStack_cdc = (int)((ulong)uVar15 >> 0x20);
    local_cf8 = (int)uVar16;
    iStack_cf4 = (int)((ulong)uVar16 >> 0x20);
    iStack_cf0 = (int)uVar17;
    iStack_cec = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 6 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 9 + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_11a8 = (int)uVar14;
    iStack_11a4 = (int)((ulong)uVar14 >> 0x20);
    iStack_11a0 = (int)uVar15;
    iStack_119c = (int)((ulong)uVar15 >> 0x20);
    local_11b8 = (int)uVar16;
    iStack_11b4 = (int)((ulong)uVar16 >> 0x20);
    iStack_11b0 = (int)uVar17;
    iStack_11ac = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 6 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 9 + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_d08 = (int)uVar14;
    iStack_d04 = (int)((ulong)uVar14 >> 0x20);
    iStack_d00 = (int)uVar15;
    iStack_cfc = (int)((ulong)uVar15 >> 0x20);
    local_d18 = (int)uVar16;
    iStack_d14 = (int)((ulong)uVar16 >> 0x20);
    iStack_d10 = (int)uVar17;
    iStack_d0c = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 7 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 8 + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_11c8 = (int)uVar14;
    iStack_11c4 = (int)((ulong)uVar14 >> 0x20);
    iStack_11c0 = (int)uVar15;
    iStack_11bc = (int)((ulong)uVar15 >> 0x20);
    local_11d8 = (int)uVar16;
    iStack_11d4 = (int)((ulong)uVar16 >> 0x20);
    iStack_11d0 = (int)uVar17;
    iStack_11cc = (int)((ulong)uVar17 >> 0x20);
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 7 + local_1c1c) * 0x10);
    uVar14 = *puVar126;
    uVar15 = puVar126[1];
    puVar126 = (undefined8 *)(in_RDI + (long)(in_ECX * 8 + local_1c1c) * 0x10);
    uVar16 = *puVar126;
    uVar17 = puVar126[1];
    local_d28 = (int)uVar14;
    iStack_d24 = (int)((ulong)uVar14 >> 0x20);
    iStack_d20 = (int)uVar15;
    iStack_d1c = (int)((ulong)uVar15 >> 0x20);
    local_d38 = (int)uVar16;
    iStack_d34 = (int)((ulong)uVar16 >> 0x20);
    iStack_d30 = (int)uVar17;
    iStack_d2c = (int)((ulong)uVar17 >> 0x20);
    iVar127 = local_10e8 + local_10f8 + local_11c8 + local_11d8;
    iVar140 = iStack_10e4 + iStack_10f4 + iStack_11c4 + iStack_11d4;
    iVar150 = iStack_10e0 + iStack_10f0 + iStack_11c0 + iStack_11d0;
    iVar162 = iStack_10dc + iStack_10ec + iStack_11bc + iStack_11cc;
    iVar128 = (local_10e8 + local_10f8) - (local_11c8 + local_11d8);
    iVar141 = (iStack_10e4 + iStack_10f4) - (iStack_11c4 + iStack_11d4);
    iVar151 = (iStack_10e0 + iStack_10f0) - (iStack_11c0 + iStack_11d0);
    iVar163 = (iStack_10dc + iStack_10ec) - (iStack_11bc + iStack_11cc);
    iVar129 = local_1108 + local_1118 + local_11a8 + local_11b8;
    iVar142 = iStack_1104 + iStack_1114 + iStack_11a4 + iStack_11b4;
    iVar152 = iStack_1100 + iStack_1110 + iStack_11a0 + iStack_11b0;
    iVar164 = iStack_10fc + iStack_110c + iStack_119c + iStack_11ac;
    local_1ba8 = CONCAT44((iStack_1104 + iStack_1114) - (iStack_11a4 + iStack_11b4),
                          (local_1108 + local_1118) - (local_11a8 + local_11b8));
    uStack_1ba0 = CONCAT44((iStack_10fc + iStack_110c) - (iStack_119c + iStack_11ac),
                           (iStack_1100 + iStack_1110) - (iStack_11a0 + iStack_11b0));
    iVar130 = local_1128 + local_1138 + local_1188 + local_1198;
    iVar143 = iStack_1124 + iStack_1134 + iStack_1184 + iStack_1194;
    iVar153 = iStack_1120 + iStack_1130 + iStack_1180 + iStack_1190;
    iVar165 = iStack_111c + iStack_112c + iStack_117c + iStack_118c;
    local_1bb8 = CONCAT44((iStack_1124 + iStack_1134) - (iStack_1184 + iStack_1194),
                          (local_1128 + local_1138) - (local_1188 + local_1198));
    uStack_1bb0 = CONCAT44((iStack_111c + iStack_112c) - (iStack_117c + iStack_118c),
                           (iStack_1120 + iStack_1130) - (iStack_1180 + iStack_1190));
    iVar131 = local_1148 + local_1158 + local_1168 + local_1178;
    iVar144 = iStack_1144 + iStack_1154 + iStack_1164 + iStack_1174;
    iVar154 = iStack_1140 + iStack_1150 + iStack_1160 + iStack_1170;
    iVar166 = iStack_113c + iStack_114c + iStack_115c + iStack_116c;
    iVar132 = (local_1148 + local_1158) - (local_1168 + local_1178);
    iVar145 = (iStack_1144 + iStack_1154) - (iStack_1164 + iStack_1174);
    iVar155 = (iStack_1140 + iStack_1150) - (iStack_1160 + iStack_1170);
    iVar167 = (iStack_113c + iStack_114c) - (iStack_115c + iStack_116c);
    auVar114._4_4_ = iStack_ce4 - iStack_cf4;
    auVar114._0_4_ = local_ce8 - local_cf8;
    auVar114._12_4_ = iStack_cdc - iStack_cec;
    auVar114._8_4_ = iStack_ce0 - iStack_cf0;
    auVar113._8_8_ = uVar118;
    auVar113._0_8_ = uVar117;
    auVar137 = pmulld(auVar114,auVar113);
    auVar112._4_4_ = iStack_c84 - iStack_c94;
    auVar112._0_4_ = local_c88 - local_c98;
    auVar112._12_4_ = iStack_c7c - iStack_c8c;
    auVar112._8_4_ = iStack_c80 - iStack_c90;
    auVar111._8_8_ = uVar116;
    auVar111._0_8_ = uVar115;
    auVar138 = pmulld(auVar112,auVar111);
    local_1268 = auVar137._0_4_;
    iStack_1264 = auVar137._4_4_;
    iStack_1260 = auVar137._8_4_;
    iStack_125c = auVar137._12_4_;
    local_1278 = auVar138._0_4_;
    iStack_1274 = auVar138._4_4_;
    iStack_1270 = auVar138._8_4_;
    iStack_126c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar133 = local_1268 + local_1278 + iVar124 >> auVar137;
    iVar146 = iStack_1264 + iStack_1274 + iVar124 >> auVar137;
    iVar156 = iStack_1260 + iStack_1270 + iVar124 >> auVar137;
    iVar168 = iStack_125c + iStack_126c + iVar124 >> auVar137;
    auVar110._4_4_ = iStack_ce4 - iStack_cf4;
    auVar110._0_4_ = local_ce8 - local_cf8;
    auVar110._12_4_ = iStack_cdc - iStack_cec;
    auVar110._8_4_ = iStack_ce0 - iStack_cf0;
    auVar109._8_8_ = uVar116;
    auVar109._0_8_ = uVar115;
    auVar137 = pmulld(auVar110,auVar109);
    auVar108._4_4_ = iStack_c84 - iStack_c94;
    auVar108._0_4_ = local_c88 - local_c98;
    auVar108._12_4_ = iStack_c7c - iStack_c8c;
    auVar108._8_4_ = iStack_c80 - iStack_c90;
    auVar107._8_8_ = uVar118;
    auVar107._0_8_ = uVar117;
    auVar138 = pmulld(auVar108,auVar107);
    local_dc8 = auVar137._0_4_;
    iStack_dc4 = auVar137._4_4_;
    iStack_dc0 = auVar137._8_4_;
    iStack_dbc = auVar137._12_4_;
    local_dd8 = auVar138._0_4_;
    iStack_dd4 = auVar138._4_4_;
    iStack_dd0 = auVar138._8_4_;
    iStack_dcc = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar134 = (local_dc8 - local_dd8) + iVar124 >> auVar137;
    iVar147 = (iStack_dc4 - iStack_dd4) + iVar124 >> auVar137;
    iVar157 = (iStack_dc0 - iStack_dd0) + iVar124 >> auVar137;
    iVar169 = (iStack_dbc - iStack_dcc) + iVar124 >> auVar137;
    auVar106._4_4_ = iStack_cc4 - iStack_cd4;
    auVar106._0_4_ = local_cc8 - local_cd8;
    auVar106._12_4_ = iStack_cbc - iStack_ccc;
    auVar106._8_4_ = iStack_cc0 - iStack_cd0;
    auVar105._8_8_ = uVar118;
    auVar105._0_8_ = uVar117;
    auVar137 = pmulld(auVar106,auVar105);
    auVar104._4_4_ = iStack_ca4 - iStack_cb4;
    auVar104._0_4_ = local_ca8 - local_cb8;
    auVar104._12_4_ = iStack_c9c - iStack_cac;
    auVar104._8_4_ = iStack_ca0 - iStack_cb0;
    auVar103._8_8_ = uVar116;
    auVar103._0_8_ = uVar115;
    auVar138 = pmulld(auVar104,auVar103);
    local_12c8 = auVar137._0_4_;
    iStack_12c4 = auVar137._4_4_;
    iStack_12c0 = auVar137._8_4_;
    iStack_12bc = auVar137._12_4_;
    local_12d8 = auVar138._0_4_;
    iStack_12d4 = auVar138._4_4_;
    iStack_12d0 = auVar138._8_4_;
    iStack_12cc = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar135 = local_12c8 + local_12d8 + iVar124 >> auVar137;
    iVar148 = iStack_12c4 + iStack_12d4 + iVar124 >> auVar137;
    iVar158 = iStack_12c0 + iStack_12d0 + iVar124 >> auVar137;
    iVar170 = iStack_12bc + iStack_12cc + iVar124 >> auVar137;
    auVar102._4_4_ = iStack_cc4 - iStack_cd4;
    auVar102._0_4_ = local_cc8 - local_cd8;
    auVar102._12_4_ = iStack_cbc - iStack_ccc;
    auVar102._8_4_ = iStack_cc0 - iStack_cd0;
    auVar101._8_8_ = uVar116;
    auVar101._0_8_ = uVar115;
    auVar137 = pmulld(auVar102,auVar101);
    auVar100._4_4_ = iStack_ca4 - iStack_cb4;
    auVar100._0_4_ = local_ca8 - local_cb8;
    auVar100._12_4_ = iStack_c9c - iStack_cac;
    auVar100._8_4_ = iStack_ca0 - iStack_cb0;
    auVar99._8_8_ = uVar118;
    auVar99._0_8_ = uVar117;
    auVar138 = pmulld(auVar100,auVar99);
    local_de8 = auVar137._0_4_;
    iStack_de4 = auVar137._4_4_;
    iStack_de0 = auVar137._8_4_;
    iStack_ddc = auVar137._12_4_;
    local_df8 = auVar138._0_4_;
    iStack_df4 = auVar138._4_4_;
    iStack_df0 = auVar138._8_4_;
    iStack_dec = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar136 = (local_de8 - local_df8) + iVar124 >> auVar137;
    iVar149 = (iStack_de4 - iStack_df4) + iVar124 >> auVar137;
    iVar159 = (iStack_de0 - iStack_df0) + iVar124 >> auVar137;
    iVar171 = (iStack_ddc - iStack_dec) + iVar124 >> auVar137;
    local_1b08 = CONCAT44(iVar140 + iVar144,iVar127 + iVar131);
    uStack_1b00._0_4_ = iVar150 + iVar154;
    uStack_1b00._4_4_ = iVar162 + iVar166;
    local_1ad8 = CONCAT44(iVar140 - iVar144,iVar127 - iVar131);
    uStack_1ad0 = CONCAT44(iVar162 - iVar166,iVar150 - iVar154);
    local_1af8 = CONCAT44(iVar142 + iVar143,iVar129 + iVar130);
    uStack_1af0._0_4_ = iVar152 + iVar153;
    uStack_1af0._4_4_ = iVar164 + iVar165;
    local_1ae8 = CONCAT44(iVar142 - iVar143,iVar129 - iVar130);
    uStack_1ae0 = CONCAT44(iVar164 - iVar165,iVar152 - iVar153);
    auVar98._8_8_ = uStack_1bb0;
    auVar98._0_8_ = local_1bb8;
    auVar97._8_8_ = uVar118;
    auVar97._0_8_ = uVar117;
    auVar137 = pmulld(auVar98,auVar97);
    auVar96._8_8_ = uStack_1ba0;
    auVar96._0_8_ = local_1ba8;
    auVar95._8_8_ = uVar116;
    auVar95._0_8_ = uVar115;
    auVar138 = pmulld(auVar96,auVar95);
    local_1368 = auVar137._0_4_;
    iStack_1364 = auVar137._4_4_;
    iStack_1360 = auVar137._8_4_;
    iStack_135c = auVar137._12_4_;
    local_1378 = auVar138._0_4_;
    iStack_1374 = auVar138._4_4_;
    iStack_1370 = auVar138._8_4_;
    iStack_136c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar127 = local_1368 + local_1378 + iVar124 >> auVar137;
    iVar143 = iStack_1364 + iStack_1374 + iVar124 >> auVar137;
    iVar162 = iStack_1360 + iStack_1370 + iVar124 >> auVar137;
    iVar172 = iStack_135c + iStack_136c + iVar124 >> auVar137;
    auVar94._8_8_ = uStack_1bb0;
    auVar94._0_8_ = local_1bb8;
    auVar93._8_8_ = uVar116;
    auVar93._0_8_ = uVar115;
    auVar137 = pmulld(auVar94,auVar93);
    auVar92._8_8_ = uStack_1ba0;
    auVar92._0_8_ = local_1ba8;
    auVar91._8_8_ = uVar118;
    auVar91._0_8_ = uVar117;
    auVar138 = pmulld(auVar92,auVar91);
    local_e48 = auVar137._0_4_;
    iStack_e44 = auVar137._4_4_;
    iStack_e40 = auVar137._8_4_;
    iStack_e3c = auVar137._12_4_;
    local_e58 = auVar138._0_4_;
    iStack_e54 = auVar138._4_4_;
    iStack_e50 = auVar138._8_4_;
    iStack_e4c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar129 = (local_e48 - local_e58) + iVar124 >> auVar137;
    iVar144 = (iStack_e44 - iStack_e54) + iVar124 >> auVar137;
    iVar164 = (iStack_e40 - iStack_e50) + iVar124 >> auVar137;
    iVar173 = (iStack_e3c - iStack_e4c) + iVar124 >> auVar137;
    iVar140 = (local_d28 - local_d38) + iVar135;
    iVar153 = (iStack_d24 - iStack_d34) + iVar148;
    iVar160 = (iStack_d20 - iStack_d30) + iVar158;
    iVar174 = (iStack_d1c - iStack_d2c) + iVar170;
    iVar135 = (local_d28 - local_d38) - iVar135;
    iVar148 = (iStack_d24 - iStack_d34) - iVar148;
    iVar158 = (iStack_d20 - iStack_d30) - iVar158;
    iVar170 = (iStack_d1c - iStack_d2c) - iVar170;
    iVar130 = (local_d08 - local_d18) + iVar133;
    iVar150 = (iStack_d04 - iStack_d14) + iVar146;
    iVar165 = (iStack_d00 - iStack_d10) + iVar156;
    iVar175 = (iStack_cfc - iStack_d0c) + iVar168;
    iVar133 = (local_d08 - local_d18) - iVar133;
    iVar146 = (iStack_d04 - iStack_d14) - iVar146;
    iVar156 = (iStack_d00 - iStack_d10) - iVar156;
    iVar168 = (iStack_cfc - iStack_d0c) - iVar168;
    iVar142 = (local_c48 - local_c58) - iVar136;
    iVar154 = (iStack_c44 - iStack_c54) - iVar149;
    iVar161 = (iStack_c40 - iStack_c50) - iVar159;
    iVar176 = (iStack_c3c - iStack_c4c) - iVar171;
    iVar136 = (local_c48 - local_c58) + iVar136;
    iVar149 = (iStack_c44 - iStack_c54) + iVar149;
    iVar159 = (iStack_c40 - iStack_c50) + iVar159;
    iVar171 = (iStack_c3c - iStack_c4c) + iVar171;
    iVar131 = (local_c68 - local_c78) - iVar134;
    iVar152 = (iStack_c64 - iStack_c74) - iVar147;
    iVar166 = (iStack_c60 - iStack_c70) - iVar157;
    iVar177 = (iStack_c5c - iStack_c6c) - iVar169;
    iVar134 = (local_c68 - local_c78) + iVar134;
    iVar147 = (iStack_c64 - iStack_c74) + iVar147;
    iVar157 = (iStack_c60 - iStack_c70) + iVar157;
    iVar169 = (iStack_c5c - iStack_c6c) + iVar169;
    auVar90._8_8_ = uStack_1b00;
    auVar90._0_8_ = local_1b08;
    auVar89._8_8_ = uVar116;
    auVar89._0_8_ = uVar115;
    auVar137 = pmulld(auVar90,auVar89);
    auVar88._8_8_ = uStack_1af0;
    auVar88._0_8_ = local_1af8;
    auVar87._8_8_ = uVar116;
    auVar87._0_8_ = uVar115;
    auVar138 = pmulld(auVar88,auVar87);
    local_1448 = auVar137._0_4_;
    iStack_1444 = auVar137._4_4_;
    iStack_1440 = auVar137._8_4_;
    iStack_143c = auVar137._12_4_;
    local_1458 = auVar138._0_4_;
    iStack_1454 = auVar138._4_4_;
    iStack_1450 = auVar138._8_4_;
    iStack_144c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1c08 = CONCAT44(iStack_1444 + iStack_1454 + iVar124 >> auVar137,
                          local_1448 + local_1458 + iVar124 >> auVar137);
    uStack_1c00 = CONCAT44(iStack_143c + iStack_144c + iVar124 >> auVar137,
                           iStack_1440 + iStack_1450 + iVar124 >> auVar137);
    auVar137 = ZEXT416(in_EDX);
    local_1bf8 = CONCAT44((iStack_1444 - iStack_1454) + iVar124 >> auVar137,
                          (local_1448 - local_1458) + iVar124 >> auVar137);
    uStack_1bf0 = CONCAT44((iStack_143c - iStack_144c) + iVar124 >> auVar137,
                           (iStack_1440 - iStack_1450) + iVar124 >> auVar137);
    auVar86._8_8_ = uStack_1ae0;
    auVar86._0_8_ = local_1ae8;
    auVar85._8_8_ = uVar120;
    auVar85._0_8_ = uVar119;
    auVar137 = pmulld(auVar86,auVar85);
    auVar84._8_8_ = uStack_1ad0;
    auVar84._0_8_ = local_1ad8;
    auVar83._8_8_ = CONCAT44(iVar1,iVar1);
    auVar83._0_8_ = CONCAT44(iVar1,iVar1);
    auVar138 = pmulld(auVar84,auVar83);
    local_14a8 = auVar137._0_4_;
    iStack_14a4 = auVar137._4_4_;
    iStack_14a0 = auVar137._8_4_;
    iStack_149c = auVar137._12_4_;
    local_14b8 = auVar138._0_4_;
    iStack_14b4 = auVar138._4_4_;
    iStack_14b0 = auVar138._8_4_;
    iStack_14ac = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1be8 = CONCAT44(iStack_14a4 + iStack_14b4 + iVar124 >> auVar137,
                          local_14a8 + local_14b8 + iVar124 >> auVar137);
    uStack_1be0._0_4_ = iStack_14a0 + iStack_14b0 + iVar124 >> auVar137;
    uStack_1be0._4_4_ = iStack_149c + iStack_14ac + iVar124 >> auVar137;
    auVar82._8_8_ = uStack_1ae0;
    auVar82._0_8_ = local_1ae8;
    auVar81._8_8_ = CONCAT44(iVar1,iVar1);
    auVar81._0_8_ = CONCAT44(iVar1,iVar1);
    auVar137 = pmulld(auVar82,auVar81);
    auVar80._8_8_ = uStack_1ad0;
    auVar80._0_8_ = local_1ad8;
    auVar79._8_8_ = uVar120;
    auVar79._0_8_ = uVar119;
    auVar138 = pmulld(auVar80,auVar79);
    local_f08 = auVar138._0_4_;
    iStack_f04 = auVar138._4_4_;
    iStack_f00 = auVar138._8_4_;
    iStack_efc = auVar138._12_4_;
    local_f18 = auVar137._0_4_;
    iStack_f14 = auVar137._4_4_;
    iStack_f10 = auVar137._8_4_;
    iStack_f0c = auVar137._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1bd8 = CONCAT44((iStack_f04 - iStack_f14) + iVar124 >> auVar137,
                          (local_f08 - local_f18) + iVar124 >> auVar137);
    uStack_1bd0._0_4_ = (iStack_f00 - iStack_f10) + iVar124 >> auVar137;
    uStack_1bd0._4_4_ = (iStack_efc - iStack_f0c) + iVar124 >> auVar137;
    local_1bc8 = CONCAT44(iVar145 + iVar143,iVar132 + iVar127);
    uStack_1bc0 = CONCAT44(iVar167 + iVar172,iVar155 + iVar162);
    local_1bb8 = CONCAT44(iVar145 - iVar143,iVar132 - iVar127);
    uStack_1bb0 = CONCAT44(iVar167 - iVar172,iVar155 - iVar162);
    local_1ba8 = CONCAT44(iVar141 - iVar144,iVar128 - iVar129);
    uStack_1ba0 = CONCAT44(iVar163 - iVar173,iVar151 - iVar164);
    local_1b98 = CONCAT44(iVar141 + iVar144,iVar128 + iVar129);
    uStack_1b90 = CONCAT44(iVar163 + iVar173,iVar151 + iVar164);
    auVar78._4_4_ = iVar150;
    auVar78._0_4_ = iVar130;
    auVar78._12_4_ = iVar175;
    auVar78._8_4_ = iVar165;
    auVar77._8_8_ = uVar122;
    auVar77._0_8_ = uVar121;
    auVar137 = pmulld(auVar78,auVar77);
    auVar76._4_4_ = iVar147;
    auVar76._0_4_ = iVar134;
    auVar76._12_4_ = iVar169;
    auVar76._8_4_ = iVar157;
    auVar75._8_8_ = uVar120;
    auVar75._0_8_ = uVar119;
    auVar138 = pmulld(auVar76,auVar75);
    local_1548 = auVar137._0_4_;
    iStack_1544 = auVar137._4_4_;
    iStack_1540 = auVar137._8_4_;
    iStack_153c = auVar137._12_4_;
    local_1558 = auVar138._0_4_;
    iStack_1554 = auVar138._4_4_;
    iStack_1550 = auVar138._8_4_;
    iStack_154c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar127 = local_1548 + local_1558 + iVar124 >> auVar137;
    iVar132 = iStack_1544 + iStack_1554 + iVar124 >> auVar137;
    iVar144 = iStack_1540 + iStack_1550 + iVar124 >> auVar137;
    iVar151 = iStack_153c + iStack_154c + iVar124 >> auVar137;
    auVar74._4_4_ = iVar150;
    auVar74._0_4_ = iVar130;
    auVar74._12_4_ = iVar175;
    auVar74._8_4_ = iVar165;
    auVar73._8_8_ = uVar120;
    auVar73._0_8_ = uVar119;
    auVar137 = pmulld(auVar74,auVar73);
    auVar72._4_4_ = iVar147;
    auVar72._0_4_ = iVar134;
    auVar72._12_4_ = iVar169;
    auVar72._8_4_ = iVar157;
    auVar71._8_8_ = uVar122;
    auVar71._0_8_ = uVar121;
    auVar138 = pmulld(auVar72,auVar71);
    local_f68 = auVar137._0_4_;
    iStack_f64 = auVar137._4_4_;
    iStack_f60 = auVar137._8_4_;
    iStack_f5c = auVar137._12_4_;
    local_f78 = auVar138._0_4_;
    iStack_f74 = auVar138._4_4_;
    iStack_f70 = auVar138._8_4_;
    iStack_f6c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar128 = (local_f68 - local_f78) + iVar124 >> auVar137;
    iVar134 = (iStack_f64 - iStack_f74) + iVar124 >> auVar137;
    iVar145 = (iStack_f60 - iStack_f70) + iVar124 >> auVar137;
    iVar147 = (iStack_f5c - iStack_f6c) + iVar124 >> auVar137;
    auVar70._4_4_ = iVar146;
    auVar70._0_4_ = iVar133;
    auVar70._12_4_ = iVar168;
    auVar70._8_4_ = iVar156;
    auVar69._8_8_ = CONCAT44(iVar123,iVar123);
    auVar69._0_8_ = CONCAT44(iVar123,iVar123);
    auVar137 = pmulld(auVar70,auVar69);
    auVar68._4_4_ = iVar152;
    auVar68._0_4_ = iVar131;
    auVar68._12_4_ = iVar177;
    auVar68._8_4_ = iVar166;
    auVar67._8_8_ = uVar122;
    auVar67._0_8_ = uVar121;
    auVar138 = pmulld(auVar68,auVar67);
    local_15a8 = auVar137._0_4_;
    iStack_15a4 = auVar137._4_4_;
    iStack_15a0 = auVar137._8_4_;
    iStack_159c = auVar137._12_4_;
    local_15b8 = auVar138._0_4_;
    iStack_15b4 = auVar138._4_4_;
    iStack_15b0 = auVar138._8_4_;
    iStack_15ac = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar129 = local_15a8 + local_15b8 + iVar124 >> auVar137;
    iVar141 = iStack_15a4 + iStack_15b4 + iVar124 >> auVar137;
    iVar150 = iStack_15a0 + iStack_15b0 + iVar124 >> auVar137;
    iVar155 = iStack_159c + iStack_15ac + iVar124 >> auVar137;
    auVar66._4_4_ = iVar146;
    auVar66._0_4_ = iVar133;
    auVar66._12_4_ = iVar168;
    auVar66._8_4_ = iVar156;
    auVar65._8_8_ = uVar122;
    auVar65._0_8_ = uVar121;
    auVar137 = pmulld(auVar66,auVar65);
    auVar64._4_4_ = iVar152;
    auVar64._0_4_ = iVar131;
    auVar64._12_4_ = iVar177;
    auVar64._8_4_ = iVar166;
    auVar63._8_8_ = CONCAT44(iVar123,iVar123);
    auVar63._0_8_ = CONCAT44(iVar123,iVar123);
    auVar138 = pmulld(auVar64,auVar63);
    local_f88 = auVar137._0_4_;
    iStack_f84 = auVar137._4_4_;
    iStack_f80 = auVar137._8_4_;
    iStack_f7c = auVar137._12_4_;
    local_f98 = auVar138._0_4_;
    iStack_f94 = auVar138._4_4_;
    iStack_f90 = auVar138._8_4_;
    iStack_f8c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    iVar130 = (local_f88 - local_f98) + iVar124 >> auVar137;
    iVar133 = (iStack_f84 - iStack_f94) + iVar124 >> auVar137;
    iVar146 = (iStack_f80 - iStack_f90) + iVar124 >> auVar137;
    iVar162 = (iStack_f7c - iStack_f8c) + iVar124 >> auVar137;
    auVar62._8_8_ = uStack_1bc0;
    auVar62._0_8_ = local_1bc8;
    auVar61._8_8_ = CONCAT44(iVar2,iVar2);
    auVar61._0_8_ = CONCAT44(iVar2,iVar2);
    auVar137 = pmulld(auVar62,auVar61);
    auVar60._8_8_ = uStack_1b90;
    auVar60._0_8_ = local_1b98;
    auVar59._8_8_ = CONCAT44(iVar3,iVar3);
    auVar59._0_8_ = CONCAT44(iVar3,iVar3);
    auVar138 = pmulld(auVar60,auVar59);
    local_1608 = auVar137._0_4_;
    iStack_1604 = auVar137._4_4_;
    iStack_1600 = auVar137._8_4_;
    iStack_15fc = auVar137._12_4_;
    local_1618 = auVar138._0_4_;
    iStack_1614 = auVar138._4_4_;
    iStack_1610 = auVar138._8_4_;
    iStack_160c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1ac8 = CONCAT44(iStack_1604 + iStack_1614 + iVar124 >> auVar137,
                          local_1608 + local_1618 + iVar124 >> auVar137);
    uStack_1ac0._0_4_ = iStack_1600 + iStack_1610 + iVar124 >> auVar137;
    uStack_1ac0._4_4_ = iStack_15fc + iStack_160c + iVar124 >> auVar137;
    auVar58._8_8_ = uStack_1bc0;
    auVar58._0_8_ = local_1bc8;
    auVar57._8_8_ = CONCAT44(iVar3,iVar3);
    auVar57._0_8_ = CONCAT44(iVar3,iVar3);
    auVar137 = pmulld(auVar58,auVar57);
    auVar56._8_8_ = uStack_1b90;
    auVar56._0_8_ = local_1b98;
    auVar55._8_8_ = CONCAT44(iVar2,iVar2);
    auVar55._0_8_ = CONCAT44(iVar2,iVar2);
    auVar138 = pmulld(auVar56,auVar55);
    local_fa8 = auVar138._0_4_;
    iStack_fa4 = auVar138._4_4_;
    iStack_fa0 = auVar138._8_4_;
    iStack_f9c = auVar138._12_4_;
    local_fb8 = auVar137._0_4_;
    iStack_fb4 = auVar137._4_4_;
    iStack_fb0 = auVar137._8_4_;
    iStack_fac = auVar137._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1a98 = CONCAT44((iStack_fa4 - iStack_fb4) + iVar124 >> auVar137,
                          (local_fa8 - local_fb8) + iVar124 >> auVar137);
    uStack_1a90._0_4_ = (iStack_fa0 - iStack_fb0) + iVar124 >> auVar137;
    uStack_1a90._4_4_ = (iStack_f9c - iStack_fac) + iVar124 >> auVar137;
    auVar54._8_8_ = uStack_1bb0;
    auVar54._0_8_ = local_1bb8;
    auVar53._8_8_ = CONCAT44(iVar4,iVar4);
    auVar53._0_8_ = CONCAT44(iVar4,iVar4);
    auVar137 = pmulld(auVar54,auVar53);
    auVar52._8_8_ = uStack_1ba0;
    auVar52._0_8_ = local_1ba8;
    auVar51._8_8_ = CONCAT44(iVar5,iVar5);
    auVar51._0_8_ = CONCAT44(iVar5,iVar5);
    auVar138 = pmulld(auVar52,auVar51);
    local_1668 = auVar137._0_4_;
    iStack_1664 = auVar137._4_4_;
    iStack_1660 = auVar137._8_4_;
    iStack_165c = auVar137._12_4_;
    local_1678 = auVar138._0_4_;
    iStack_1674 = auVar138._4_4_;
    iStack_1670 = auVar138._8_4_;
    iStack_166c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1ab8 = CONCAT44(iStack_1664 + iStack_1674 + iVar124 >> auVar137,
                          local_1668 + local_1678 + iVar124 >> auVar137);
    uStack_1ab0._0_4_ = iStack_1660 + iStack_1670 + iVar124 >> auVar137;
    uStack_1ab0._4_4_ = iStack_165c + iStack_166c + iVar124 >> auVar137;
    auVar50._8_8_ = uStack_1bb0;
    auVar50._0_8_ = local_1bb8;
    auVar49._8_8_ = CONCAT44(iVar5,iVar5);
    auVar49._0_8_ = CONCAT44(iVar5,iVar5);
    auVar137 = pmulld(auVar50,auVar49);
    auVar48._8_8_ = uStack_1ba0;
    auVar48._0_8_ = local_1ba8;
    auVar47._8_8_ = CONCAT44(iVar4,iVar4);
    auVar47._0_8_ = CONCAT44(iVar4,iVar4);
    auVar138 = pmulld(auVar48,auVar47);
    local_fc8 = auVar138._0_4_;
    iStack_fc4 = auVar138._4_4_;
    iStack_fc0 = auVar138._8_4_;
    iStack_fbc = auVar138._12_4_;
    local_fd8 = auVar137._0_4_;
    iStack_fd4 = auVar137._4_4_;
    iStack_fd0 = auVar137._8_4_;
    iStack_fcc = auVar137._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1aa8 = CONCAT44((iStack_fc4 - iStack_fd4) + iVar124 >> auVar137,
                          (local_fc8 - local_fd8) + iVar124 >> auVar137);
    uStack_1aa0._0_4_ = (iStack_fc0 - iStack_fd0) + iVar124 >> auVar137;
    uStack_1aa0._4_4_ = (iStack_fbc - iStack_fcc) + iVar124 >> auVar137;
    iVar131 = iVar140 + iVar127;
    iVar143 = iVar153 + iVar132;
    iVar152 = iVar160 + iVar144;
    iVar164 = iVar174 + iVar151;
    iVar140 = iVar140 - iVar127;
    iVar153 = iVar153 - iVar132;
    iVar160 = iVar160 - iVar144;
    iVar174 = iVar174 - iVar151;
    iVar127 = iVar135 - iVar129;
    iVar132 = iVar148 - iVar141;
    iVar144 = iVar158 - iVar150;
    iVar151 = iVar170 - iVar155;
    iVar135 = iVar135 + iVar129;
    iVar148 = iVar148 + iVar141;
    iVar158 = iVar158 + iVar150;
    iVar170 = iVar170 + iVar155;
    iVar129 = iVar142 + iVar130;
    iVar141 = iVar154 + iVar133;
    iVar150 = iVar161 + iVar146;
    iVar155 = iVar176 + iVar162;
    iVar142 = iVar142 - iVar130;
    iVar154 = iVar154 - iVar133;
    iVar161 = iVar161 - iVar146;
    iVar176 = iVar176 - iVar162;
    iVar130 = iVar136 - iVar128;
    iVar133 = iVar149 - iVar134;
    iVar146 = iVar159 - iVar145;
    iVar162 = iVar171 - iVar147;
    iVar136 = iVar136 + iVar128;
    iVar149 = iVar149 + iVar134;
    iVar159 = iVar159 + iVar145;
    iVar171 = iVar171 + iVar147;
    auVar46._4_4_ = iVar143;
    auVar46._0_4_ = iVar131;
    auVar46._12_4_ = iVar164;
    auVar46._8_4_ = iVar152;
    auVar45._8_8_ = CONCAT44(iVar6,iVar6);
    auVar45._0_8_ = CONCAT44(iVar6,iVar6);
    auVar137 = pmulld(auVar46,auVar45);
    auVar44._4_4_ = iVar149;
    auVar44._0_4_ = iVar136;
    auVar44._12_4_ = iVar171;
    auVar44._8_4_ = iVar159;
    auVar43._8_8_ = CONCAT44(iVar7,iVar7);
    auVar43._0_8_ = CONCAT44(iVar7,iVar7);
    auVar138 = pmulld(auVar44,auVar43);
    local_1748 = auVar137._0_4_;
    iStack_1744 = auVar137._4_4_;
    iStack_1740 = auVar137._8_4_;
    iStack_173c = auVar137._12_4_;
    local_1758 = auVar138._0_4_;
    iStack_1754 = auVar138._4_4_;
    iStack_1750 = auVar138._8_4_;
    iStack_174c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b88 = CONCAT44(iStack_1744 + iStack_1754 + iVar124 >> auVar137,
                          local_1748 + local_1758 + iVar124 >> auVar137);
    uStack_1b80._0_4_ = iStack_1740 + iStack_1750 + iVar124 >> auVar137;
    uStack_1b80._4_4_ = iStack_173c + iStack_174c + iVar124 >> auVar137;
    auVar42._4_4_ = iVar143;
    auVar42._0_4_ = iVar131;
    auVar42._12_4_ = iVar164;
    auVar42._8_4_ = iVar152;
    auVar41._8_8_ = CONCAT44(iVar7,iVar7);
    auVar41._0_8_ = CONCAT44(iVar7,iVar7);
    auVar137 = pmulld(auVar42,auVar41);
    auVar40._4_4_ = iVar149;
    auVar40._0_4_ = iVar136;
    auVar40._12_4_ = iVar171;
    auVar40._8_4_ = iVar159;
    auVar39._8_8_ = CONCAT44(iVar6,iVar6);
    auVar39._0_8_ = CONCAT44(iVar6,iVar6);
    auVar138 = pmulld(auVar40,auVar39);
    local_1068 = auVar138._0_4_;
    iStack_1064 = auVar138._4_4_;
    iStack_1060 = auVar138._8_4_;
    iStack_105c = auVar138._12_4_;
    local_1078 = auVar137._0_4_;
    iStack_1074 = auVar137._4_4_;
    iStack_1070 = auVar137._8_4_;
    iStack_106c = auVar137._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b18 = CONCAT44((iStack_1064 - iStack_1074) + iVar124 >> auVar137,
                          (local_1068 - local_1078) + iVar124 >> auVar137);
    uStack_1b10._0_4_ = (iStack_1060 - iStack_1070) + iVar124 >> auVar137;
    uStack_1b10._4_4_ = (iStack_105c - iStack_106c) + iVar124 >> auVar137;
    auVar38._4_4_ = iVar153;
    auVar38._0_4_ = iVar140;
    auVar38._12_4_ = iVar174;
    auVar38._8_4_ = iVar160;
    auVar37._8_8_ = CONCAT44(iVar8,iVar8);
    auVar37._0_8_ = CONCAT44(iVar8,iVar8);
    auVar137 = pmulld(auVar38,auVar37);
    auVar36._4_4_ = iVar133;
    auVar36._0_4_ = iVar130;
    auVar36._12_4_ = iVar162;
    auVar36._8_4_ = iVar146;
    auVar35._8_8_ = CONCAT44(iVar9,iVar9);
    auVar35._0_8_ = CONCAT44(iVar9,iVar9);
    auVar138 = pmulld(auVar36,auVar35);
    local_17a8 = auVar137._0_4_;
    iStack_17a4 = auVar137._4_4_;
    iStack_17a0 = auVar137._8_4_;
    iStack_179c = auVar137._12_4_;
    local_17b8 = auVar138._0_4_;
    iStack_17b4 = auVar138._4_4_;
    iStack_17b0 = auVar138._8_4_;
    iStack_17ac = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b78 = CONCAT44(iStack_17a4 + iStack_17b4 + iVar124 >> auVar137,
                          local_17a8 + local_17b8 + iVar124 >> auVar137);
    uStack_1b70._0_4_ = iStack_17a0 + iStack_17b0 + iVar124 >> auVar137;
    uStack_1b70._4_4_ = iStack_179c + iStack_17ac + iVar124 >> auVar137;
    auVar34._4_4_ = iVar153;
    auVar34._0_4_ = iVar140;
    auVar34._12_4_ = iVar174;
    auVar34._8_4_ = iVar160;
    auVar33._8_8_ = CONCAT44(iVar9,iVar9);
    auVar33._0_8_ = CONCAT44(iVar9,iVar9);
    auVar137 = pmulld(auVar34,auVar33);
    auVar32._4_4_ = iVar133;
    auVar32._0_4_ = iVar130;
    auVar32._12_4_ = iVar162;
    auVar32._8_4_ = iVar146;
    auVar31._8_8_ = CONCAT44(iVar8,iVar8);
    auVar31._0_8_ = CONCAT44(iVar8,iVar8);
    auVar138 = pmulld(auVar32,auVar31);
    local_1088 = auVar138._0_4_;
    iStack_1084 = auVar138._4_4_;
    iStack_1080 = auVar138._8_4_;
    iStack_107c = auVar138._12_4_;
    local_1098 = auVar137._0_4_;
    iStack_1094 = auVar137._4_4_;
    iStack_1090 = auVar137._8_4_;
    iStack_108c = auVar137._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b28 = CONCAT44((iStack_1084 - iStack_1094) + iVar124 >> auVar137,
                          (local_1088 - local_1098) + iVar124 >> auVar137);
    uStack_1b20._0_4_ = (iStack_1080 - iStack_1090) + iVar124 >> auVar137;
    uStack_1b20._4_4_ = (iStack_107c - iStack_108c) + iVar124 >> auVar137;
    auVar30._4_4_ = iVar132;
    auVar30._0_4_ = iVar127;
    auVar30._12_4_ = iVar151;
    auVar30._8_4_ = iVar144;
    auVar29._8_8_ = CONCAT44(iVar10,iVar10);
    auVar29._0_8_ = CONCAT44(iVar10,iVar10);
    auVar137 = pmulld(auVar30,auVar29);
    auVar28._4_4_ = iVar154;
    auVar28._0_4_ = iVar142;
    auVar28._12_4_ = iVar176;
    auVar28._8_4_ = iVar161;
    auVar27._8_8_ = CONCAT44(iVar11,iVar11);
    auVar27._0_8_ = CONCAT44(iVar11,iVar11);
    auVar138 = pmulld(auVar28,auVar27);
    local_1808 = auVar137._0_4_;
    iStack_1804 = auVar137._4_4_;
    iStack_1800 = auVar137._8_4_;
    iStack_17fc = auVar137._12_4_;
    local_1818 = auVar138._0_4_;
    iStack_1814 = auVar138._4_4_;
    iStack_1810 = auVar138._8_4_;
    iStack_180c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b68 = CONCAT44(iStack_1804 + iStack_1814 + iVar124 >> auVar137,
                          local_1808 + local_1818 + iVar124 >> auVar137);
    uStack_1b60._0_4_ = iStack_1800 + iStack_1810 + iVar124 >> auVar137;
    uStack_1b60._4_4_ = iStack_17fc + iStack_180c + iVar124 >> auVar137;
    auVar26._4_4_ = iVar132;
    auVar26._0_4_ = iVar127;
    auVar26._12_4_ = iVar151;
    auVar26._8_4_ = iVar144;
    auVar25._8_8_ = CONCAT44(iVar11,iVar11);
    auVar25._0_8_ = CONCAT44(iVar11,iVar11);
    auVar137 = pmulld(auVar26,auVar25);
    auVar24._4_4_ = iVar154;
    auVar24._0_4_ = iVar142;
    auVar24._12_4_ = iVar176;
    auVar24._8_4_ = iVar161;
    auVar23._8_8_ = CONCAT44(iVar10,iVar10);
    auVar23._0_8_ = CONCAT44(iVar10,iVar10);
    auVar138 = pmulld(auVar24,auVar23);
    local_10a8 = auVar138._0_4_;
    iStack_10a4 = auVar138._4_4_;
    iStack_10a0 = auVar138._8_4_;
    iStack_109c = auVar138._12_4_;
    local_10b8 = auVar137._0_4_;
    iStack_10b4 = auVar137._4_4_;
    iStack_10b0 = auVar137._8_4_;
    iStack_10ac = auVar137._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b38 = CONCAT44((iStack_10a4 - iStack_10b4) + iVar124 >> auVar137,
                          (local_10a8 - local_10b8) + iVar124 >> auVar137);
    uStack_1b30._0_4_ = (iStack_10a0 - iStack_10b0) + iVar124 >> auVar137;
    uStack_1b30._4_4_ = (iStack_109c - iStack_10ac) + iVar124 >> auVar137;
    auVar22._4_4_ = iVar148;
    auVar22._0_4_ = iVar135;
    auVar22._12_4_ = iVar170;
    auVar22._8_4_ = iVar158;
    auVar21._8_8_ = CONCAT44(iVar12,iVar12);
    auVar21._0_8_ = CONCAT44(iVar12,iVar12);
    auVar137 = pmulld(auVar22,auVar21);
    auVar20._4_4_ = iVar141;
    auVar20._0_4_ = iVar129;
    auVar20._12_4_ = iVar155;
    auVar20._8_4_ = iVar150;
    auVar19._8_8_ = CONCAT44(iVar13,iVar13);
    auVar19._0_8_ = CONCAT44(iVar13,iVar13);
    auVar138 = pmulld(auVar20,auVar19);
    local_1868 = auVar137._0_4_;
    iStack_1864 = auVar137._4_4_;
    iStack_1860 = auVar137._8_4_;
    iStack_185c = auVar137._12_4_;
    local_1878 = auVar138._0_4_;
    iStack_1874 = auVar138._4_4_;
    iStack_1870 = auVar138._8_4_;
    iStack_186c = auVar138._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b58 = CONCAT44(iStack_1864 + iStack_1874 + iVar124 >> auVar137,
                          local_1868 + local_1878 + iVar124 >> auVar137);
    uStack_1b50._0_4_ = iStack_1860 + iStack_1870 + iVar124 >> auVar137;
    uStack_1b50._4_4_ = iStack_185c + iStack_186c + iVar124 >> auVar137;
    auVar18._4_4_ = iVar148;
    auVar18._0_4_ = iVar135;
    auVar18._12_4_ = iVar170;
    auVar18._8_4_ = iVar158;
    auVar139._8_8_ = CONCAT44(iVar13,iVar13);
    auVar139._0_8_ = CONCAT44(iVar13,iVar13);
    auVar139 = pmulld(auVar18,auVar139);
    auVar138._4_4_ = iVar141;
    auVar138._0_4_ = iVar129;
    auVar138._12_4_ = iVar155;
    auVar138._8_4_ = iVar150;
    auVar137._8_8_ = CONCAT44(iVar12,iVar12);
    auVar137._0_8_ = CONCAT44(iVar12,iVar12);
    auVar137 = pmulld(auVar138,auVar137);
    local_10c8 = auVar137._0_4_;
    iStack_10c4 = auVar137._4_4_;
    iStack_10c0 = auVar137._8_4_;
    iStack_10bc = auVar137._12_4_;
    local_10d8 = auVar139._0_4_;
    iStack_10d4 = auVar139._4_4_;
    iStack_10d0 = auVar139._8_4_;
    iStack_10cc = auVar139._12_4_;
    auVar137 = ZEXT416(in_EDX);
    local_1b48 = CONCAT44((iStack_10c4 - iStack_10d4) + iVar124 >> auVar137,
                          (local_10c8 - local_10d8) + iVar124 >> auVar137);
    uStack_1b40._0_4_ = (iStack_10c0 - iStack_10d0) + iVar124 >> auVar137;
    uStack_1b40._4_4_ = (iStack_10bc - iStack_10cc) + iVar124 >> auVar137;
    puVar126 = (undefined8 *)(in_RSI + (long)local_1c1c * 0x10);
    *puVar126 = local_1c08;
    puVar126[1] = uStack_1c00;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX + local_1c1c) * 0x10);
    *puVar126 = local_1b88;
    puVar126[1] = uStack_1b80;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 2 + local_1c1c) * 0x10);
    *puVar126 = local_1ac8;
    puVar126[1] = uStack_1ac0;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 3 + local_1c1c) * 0x10);
    *puVar126 = local_1b48;
    puVar126[1] = uStack_1b40;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 4 + local_1c1c) * 0x10);
    *puVar126 = local_1be8;
    puVar126[1] = uStack_1be0;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 5 + local_1c1c) * 0x10);
    *puVar126 = local_1b68;
    puVar126[1] = uStack_1b60;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 6 + local_1c1c) * 0x10);
    *puVar126 = local_1aa8;
    puVar126[1] = uStack_1aa0;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 7 + local_1c1c) * 0x10);
    *puVar126 = local_1b28;
    puVar126[1] = uStack_1b20;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 8 + local_1c1c) * 0x10);
    *puVar126 = local_1bf8;
    puVar126[1] = uStack_1bf0;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 9 + local_1c1c) * 0x10);
    *puVar126 = local_1b78;
    puVar126[1] = uStack_1b70;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 10 + local_1c1c) * 0x10);
    *puVar126 = local_1ab8;
    puVar126[1] = uStack_1ab0;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 0xb + local_1c1c) * 0x10);
    *puVar126 = local_1b38;
    puVar126[1] = uStack_1b30;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 0xc + local_1c1c) * 0x10);
    *puVar126 = local_1bd8;
    puVar126[1] = uStack_1bd0;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 0xd + local_1c1c) * 0x10);
    *puVar126 = local_1b58;
    puVar126[1] = uStack_1b50;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 0xe + local_1c1c) * 0x10);
    *puVar126 = local_1a98;
    puVar126[1] = uStack_1a90;
    puVar126 = (undefined8 *)(in_RSI + (long)(in_ECX * 0xf + local_1c1c) * 0x10);
    *puVar126 = local_1b18;
    puVar126[1] = uStack_1b10;
  }
  return;
}

Assistant:

static void fdct16x16_sse4_1(__m128i *in, __m128i *out, int bit,
                             const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i u[16], v[16], x;
  int col;

  // Calculate the column 0, 1, 2, 3
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u[0] = _mm_add_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[15] = _mm_sub_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[1] = _mm_add_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[14] = _mm_sub_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[2] = _mm_add_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[13] = _mm_sub_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[3] = _mm_add_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[12] = _mm_sub_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[4] = _mm_add_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[11] = _mm_sub_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[5] = _mm_add_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[10] = _mm_sub_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[6] = _mm_add_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[9] = _mm_sub_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[7] = _mm_add_epi32(in[7 * col_num + col], in[8 * col_num + col]);
    u[8] = _mm_sub_epi32(in[7 * col_num + col], in[8 * col_num + col]);

    // stage 2
    v[0] = _mm_add_epi32(u[0], u[7]);
    v[7] = _mm_sub_epi32(u[0], u[7]);
    v[1] = _mm_add_epi32(u[1], u[6]);
    v[6] = _mm_sub_epi32(u[1], u[6]);
    v[2] = _mm_add_epi32(u[2], u[5]);
    v[5] = _mm_sub_epi32(u[2], u[5]);
    v[3] = _mm_add_epi32(u[3], u[4]);
    v[4] = _mm_sub_epi32(u[3], u[4]);
    v[8] = u[8];
    v[9] = u[9];

    v[10] = _mm_mullo_epi32(u[10], cospim32);
    x = _mm_mullo_epi32(u[13], cospi32);
    v[10] = _mm_add_epi32(v[10], x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_mullo_epi32(u[10], cospi32);
    x = _mm_mullo_epi32(u[13], cospim32);
    v[13] = _mm_sub_epi32(v[13], x);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    v[11] = _mm_mullo_epi32(u[11], cospim32);
    x = _mm_mullo_epi32(u[12], cospi32);
    v[11] = _mm_add_epi32(v[11], x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_mullo_epi32(u[11], cospi32);
    x = _mm_mullo_epi32(u[12], cospim32);
    v[12] = _mm_sub_epi32(v[12], x);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);
    v[14] = u[14];
    v[15] = u[15];

    // stage 3
    u[0] = _mm_add_epi32(v[0], v[3]);
    u[3] = _mm_sub_epi32(v[0], v[3]);
    u[1] = _mm_add_epi32(v[1], v[2]);
    u[2] = _mm_sub_epi32(v[1], v[2]);
    u[4] = v[4];

    u[5] = _mm_mullo_epi32(v[5], cospim32);
    x = _mm_mullo_epi32(v[6], cospi32);
    u[5] = _mm_add_epi32(u[5], x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_mullo_epi32(v[5], cospi32);
    x = _mm_mullo_epi32(v[6], cospim32);
    u[6] = _mm_sub_epi32(u[6], x);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[7] = v[7];
    u[8] = _mm_add_epi32(v[8], v[11]);
    u[11] = _mm_sub_epi32(v[8], v[11]);
    u[9] = _mm_add_epi32(v[9], v[10]);
    u[10] = _mm_sub_epi32(v[9], v[10]);
    u[12] = _mm_sub_epi32(v[15], v[12]);
    u[15] = _mm_add_epi32(v[15], v[12]);
    u[13] = _mm_sub_epi32(v[14], v[13]);
    u[14] = _mm_add_epi32(v[14], v[13]);

    // stage 4
    u[0] = _mm_mullo_epi32(u[0], cospi32);
    u[1] = _mm_mullo_epi32(u[1], cospi32);
    v[0] = _mm_add_epi32(u[0], u[1]);
    v[0] = _mm_add_epi32(v[0], rnding);
    v[0] = _mm_srai_epi32(v[0], bit);

    v[1] = _mm_sub_epi32(u[0], u[1]);
    v[1] = _mm_add_epi32(v[1], rnding);
    v[1] = _mm_srai_epi32(v[1], bit);

    v[2] = _mm_mullo_epi32(u[2], cospi48);
    x = _mm_mullo_epi32(u[3], cospi16);
    v[2] = _mm_add_epi32(v[2], x);
    v[2] = _mm_add_epi32(v[2], rnding);
    v[2] = _mm_srai_epi32(v[2], bit);

    v[3] = _mm_mullo_epi32(u[2], cospi16);
    x = _mm_mullo_epi32(u[3], cospi48);
    v[3] = _mm_sub_epi32(x, v[3]);
    v[3] = _mm_add_epi32(v[3], rnding);
    v[3] = _mm_srai_epi32(v[3], bit);

    v[4] = _mm_add_epi32(u[4], u[5]);
    v[5] = _mm_sub_epi32(u[4], u[5]);
    v[6] = _mm_sub_epi32(u[7], u[6]);
    v[7] = _mm_add_epi32(u[7], u[6]);
    v[8] = u[8];

    v[9] = _mm_mullo_epi32(u[9], cospim16);
    x = _mm_mullo_epi32(u[14], cospi48);
    v[9] = _mm_add_epi32(v[9], x);
    v[9] = _mm_add_epi32(v[9], rnding);
    v[9] = _mm_srai_epi32(v[9], bit);

    v[14] = _mm_mullo_epi32(u[9], cospi48);
    x = _mm_mullo_epi32(u[14], cospim16);
    v[14] = _mm_sub_epi32(v[14], x);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[10] = _mm_mullo_epi32(u[10], cospim48);
    x = _mm_mullo_epi32(u[13], cospim16);
    v[10] = _mm_add_epi32(v[10], x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_mullo_epi32(u[10], cospim16);
    x = _mm_mullo_epi32(u[13], cospim48);
    v[13] = _mm_sub_epi32(v[13], x);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    v[11] = u[11];
    v[12] = u[12];
    v[15] = u[15];

    // stage 5
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];

    u[4] = _mm_mullo_epi32(v[4], cospi56);
    x = _mm_mullo_epi32(v[7], cospi8);
    u[4] = _mm_add_epi32(u[4], x);
    u[4] = _mm_add_epi32(u[4], rnding);
    u[4] = _mm_srai_epi32(u[4], bit);

    u[7] = _mm_mullo_epi32(v[4], cospi8);
    x = _mm_mullo_epi32(v[7], cospi56);
    u[7] = _mm_sub_epi32(x, u[7]);
    u[7] = _mm_add_epi32(u[7], rnding);
    u[7] = _mm_srai_epi32(u[7], bit);

    u[5] = _mm_mullo_epi32(v[5], cospi24);
    x = _mm_mullo_epi32(v[6], cospi40);
    u[5] = _mm_add_epi32(u[5], x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_mullo_epi32(v[5], cospi40);
    x = _mm_mullo_epi32(v[6], cospi24);
    u[6] = _mm_sub_epi32(x, u[6]);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[8] = _mm_add_epi32(v[8], v[9]);
    u[9] = _mm_sub_epi32(v[8], v[9]);
    u[10] = _mm_sub_epi32(v[11], v[10]);
    u[11] = _mm_add_epi32(v[11], v[10]);
    u[12] = _mm_add_epi32(v[12], v[13]);
    u[13] = _mm_sub_epi32(v[12], v[13]);
    u[14] = _mm_sub_epi32(v[15], v[14]);
    u[15] = _mm_add_epi32(v[15], v[14]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = _mm_mullo_epi32(u[8], cospi60);
    x = _mm_mullo_epi32(u[15], cospi4);
    v[8] = _mm_add_epi32(v[8], x);
    v[8] = _mm_add_epi32(v[8], rnding);
    v[8] = _mm_srai_epi32(v[8], bit);

    v[15] = _mm_mullo_epi32(u[8], cospi4);
    x = _mm_mullo_epi32(u[15], cospi60);
    v[15] = _mm_sub_epi32(x, v[15]);
    v[15] = _mm_add_epi32(v[15], rnding);
    v[15] = _mm_srai_epi32(v[15], bit);

    v[9] = _mm_mullo_epi32(u[9], cospi28);
    x = _mm_mullo_epi32(u[14], cospi36);
    v[9] = _mm_add_epi32(v[9], x);
    v[9] = _mm_add_epi32(v[9], rnding);
    v[9] = _mm_srai_epi32(v[9], bit);

    v[14] = _mm_mullo_epi32(u[9], cospi36);
    x = _mm_mullo_epi32(u[14], cospi28);
    v[14] = _mm_sub_epi32(x, v[14]);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[10] = _mm_mullo_epi32(u[10], cospi44);
    x = _mm_mullo_epi32(u[13], cospi20);
    v[10] = _mm_add_epi32(v[10], x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_mullo_epi32(u[10], cospi20);
    x = _mm_mullo_epi32(u[13], cospi44);
    v[13] = _mm_sub_epi32(x, v[13]);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    v[11] = _mm_mullo_epi32(u[11], cospi12);
    x = _mm_mullo_epi32(u[12], cospi52);
    v[11] = _mm_add_epi32(v[11], x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_mullo_epi32(u[11], cospi52);
    x = _mm_mullo_epi32(u[12], cospi12);
    v[12] = _mm_sub_epi32(x, v[12]);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);

    out[0 * col_num + col] = v[0];
    out[1 * col_num + col] = v[8];
    out[2 * col_num + col] = v[4];
    out[3 * col_num + col] = v[12];
    out[4 * col_num + col] = v[2];
    out[5 * col_num + col] = v[10];
    out[6 * col_num + col] = v[6];
    out[7 * col_num + col] = v[14];
    out[8 * col_num + col] = v[1];
    out[9 * col_num + col] = v[9];
    out[10 * col_num + col] = v[5];
    out[11 * col_num + col] = v[13];
    out[12 * col_num + col] = v[3];
    out[13 * col_num + col] = v[11];
    out[14 * col_num + col] = v[7];
    out[15 * col_num + col] = v[15];
  }
}